

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::DrawInstancedGeometryInstancedCase::init
          (DrawInstancedGeometryInstancedCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  ShaderProgram *this_01;
  ShaderProgramDeclaration *pSVar2;
  ostream *poVar3;
  MessageBuilder *pMVar4;
  EVP_PKEY_CTX *ctx_00;
  ostringstream buf;
  ContextType local_450;
  allocator<char> local_44a;
  allocator<char> local_449;
  string local_448;
  FragmentOutput local_424;
  string local_420;
  GeometrySource local_400;
  string local_3e0;
  FragmentSource local_3c0;
  string local_3a0;
  VertexSource local_380;
  string local_360 [32];
  string local_340 [32];
  VertexAttribute local_320;
  VertexAttribute local_2f8;
  MessageBuilder local_2d0;
  GeometryShaderDeclaration local_150;
  ShaderProgramDeclaration local_138;
  
  this_01 = (ShaderProgram *)operator_new(0x158);
  local_450.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  iVar1 = this->m_numInvocations;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_138);
  std::__cxx11::string::string<std::allocator<char>>(local_340,"a_position",&local_449);
  std::__cxx11::string::string((string *)&local_2f8,local_340);
  local_2f8.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_138,&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>(local_360,"a_offset",&local_44a);
  std::__cxx11::string::string((string *)&local_320,local_360);
  local_320.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_320);
  local_424.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_424);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
  std::operator<<((ostream *)&local_2d0,
                  "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_offset;\nvoid main (void)\n{\n\tgl_Position = a_position + a_offset;\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  specializeShader(&local_3a0,&local_448,&local_450);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d0);
  std::__cxx11::string::string((string *)&local_380,(string *)&local_3a0);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_380);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
  std::operator<<((ostream *)&local_2d0,
                  "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  specializeShader(&local_3e0,&local_448,&local_450);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d0);
  std::__cxx11::string::string((string *)&local_3c0,(string *)&local_3e0);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_3c0);
  local_150.numInvocations = (size_t)iVar1;
  local_150.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_150.outputType = GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
  local_150.numOutputVertices = 4;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_150);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
  poVar3 = std::operator<<((ostream *)&local_2d0,
                           "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points,invocations="
                          );
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,
                           ") in;\nlayout(triangle_strip, max_vertices = 3) out;\n\nvoid main (void)\n{\n\thighp vec4 basePosition = gl_in[0].gl_Position;\n\thighp float phase = float(gl_InvocationID) / float("
                          );
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(poVar3,
                  ") * 6.3;\n\thighp vec4 centerPosition = basePosition + 0.1 * vec4(cos(phase), sin(phase), 0.0, 0.0);\n\n\tgl_Position = centerPosition + vec4( 0.00, -0.1, 0.0, 0.0);\n\tEmitVertex();\n\tgl_Position = centerPosition + vec4(-0.05,  0.0, 0.0, 0.0);\n\tEmitVertex();\n\tgl_Position = centerPosition + vec4( 0.05,  0.0, 0.0, 0.0);\n\tEmitVertex();\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  specializeShader(&local_420,&local_448,&local_450);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d0);
  std::__cxx11::string::string((string *)&local_400,(string *)&local_420);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_400);
  sglr::ShaderProgram::ShaderProgram(this_01,pSVar2);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string(local_340);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_138);
  (this_01->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00a0a300;
  (this_01->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_00a0a338;
  (this_01->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_00a0a350;
  *(int *)&this_01->field_0x154 = iVar1;
  this->m_program = (InstancedExpansionShader *)this_01;
  local_2d0.m_log =
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  this_00 = &local_2d0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Rendering a single point with ");
  pMVar4 = tcu::MessageBuilder::operator<<(&local_2d0,&this->m_numInstances);
  std::operator<<((ostream *)&pMVar4->m_str," instances. ");
  std::operator<<((ostream *)&pMVar4->m_str,"Each geometry shader is invoked ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_numInvocations);
  std::operator<<((ostream *)&pMVar4->m_str," times for each primitive. ");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar1 = GeometryShaderRenderTest::init(&this->super_GeometryShaderRenderTest,ctx_00);
  return iVar1;
}

Assistant:

void DrawInstancedGeometryInstancedCase::init (void)
{
	m_program = new InstancedExpansionShader(m_context.getRenderContext().getType(), m_numInvocations);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering a single point with " << m_numInstances << " instances. "
		<< "Each geometry shader is invoked " << m_numInvocations << " times for each primitive. "
		<< tcu::TestLog::EndMessage;

	GeometryShaderRenderTest::init();
}